

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall
ThreadPool<std::packaged_task<void_()>_>::ThreadPool
          (ThreadPool<std::packaged_task<void_()>_> *this,size_t threads_number,size_t queue_size)

{
  ulong in_RSI;
  _Bind<void_(ThreadPool<std::packaged_task<void_()>_>::*(ThreadPool<std::packaged_task<void_()>_>_*))()>
  *in_RDI;
  size_t i;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  NotLockFreeQueue<std::packaged_task<void_()>_> *in_stack_ffffffffffffff80;
  tuple<ThreadPool<std::packaged_task<void_()>_>_*> *this_00;
  _Bind<void_(ThreadPool<std::packaged_task<void_()>_>::*(ThreadPool<std::packaged_task<void_()>_>_*))()>
  *__f;
  code *this_01;
  ulong local_20;
  
  NotLockFreeQueue<std::packaged_task<void_()>_>::NotLockFreeQueue
            (in_stack_ffffffffffffff80,CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)
            );
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x10a88c);
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    this_00 = &in_RDI[9]._M_bound_args;
    this_01 = execute;
    __f = in_RDI;
    std::
    bind<void(ThreadPool<std::packaged_task<void()>>::*)(),ThreadPool<std::packaged_task<void()>>*>
              (&in_RDI->_M_f,(ThreadPool<std::packaged_task<void_()>_> **)this_00);
    std::thread::
    thread<std::_Bind<void(ThreadPool<std::packaged_task<void()>>::*(ThreadPool<std::packaged_task<void()>>*))()>,,void>
              ((thread *)this_01,__f);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)this_00,
               (value_type *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    std::thread::~thread((thread *)0x10a915);
  }
  return;
}

Assistant:

ThreadPool<T>::ThreadPool(size_t threads_number, size_t queue_size) : 
            queue(queue_size), is_working(true) {
    for (size_t i = 0; i < threads_number; i++) {
        threads.push_back(std::thread(std::bind(&ThreadPool::execute, this)));
    }
}